

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictive_info.c
# Opt level: O2

double inform_predictive_info
                 (int *series,size_t n,size_t m,int b,size_t kpast,size_t kfuture,inform_error *err)

{
  ulong uVar1;
  long lVar2;
  _Bool _Var3;
  uint32_t *__ptr;
  int iVar4;
  int *piVar5;
  int *piVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  int q;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  inform_dist futures;
  inform_dist histories;
  inform_dist states;
  
  _Var3 = check_arguments(series,n,m,b,kpast,kfuture,err);
  dVar16 = NAN;
  if (!_Var3) {
    auVar18._8_4_ = (int)(kpast >> 0x20);
    auVar18._0_8_ = kpast;
    auVar18._12_4_ = 0x45300000;
    dVar16 = pow((double)b,
                 (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)kpast) - 4503599627370496.0));
    uVar12 = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16;
    auVar17._8_4_ = (int)(kfuture >> 0x20);
    auVar17._0_8_ = kfuture;
    auVar17._12_4_ = 0x45300000;
    dVar16 = pow((double)b,
                 (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)kfuture) - 4503599627370496.0));
    uVar15 = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16;
    sVar13 = uVar15 * uVar12;
    __ptr = (uint32_t *)calloc(uVar15 + uVar12 + sVar13,4);
    if (__ptr == (uint32_t *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar16 = NAN;
    }
    else {
      uVar1 = kfuture + kpast;
      futures.counts = ((m - uVar1) + 1) * n;
      histories.histogram = __ptr + sVar13;
      futures.histogram = histories.histogram + uVar12;
      piVar5 = series + kfuture + kpast;
      piVar6 = series + kpast;
      for (sVar9 = 0; iVar10 = 1, sVar9 != n; sVar9 = sVar9 + 1) {
        iVar4 = 0;
        iVar11 = iVar10;
        for (sVar7 = 0; kpast != sVar7; sVar7 = sVar7 + 1) {
          iVar11 = iVar11 * b;
          iVar4 = iVar4 * b + series[sVar7];
        }
        iVar14 = 0;
        for (sVar7 = kpast; sVar7 < uVar1; sVar7 = sVar7 + 1) {
          iVar10 = iVar10 * b;
          iVar14 = iVar14 * b + series[sVar7];
        }
        lVar8 = 0;
        do {
          __ptr[iVar4 * iVar10 + iVar14] = __ptr[iVar4 * iVar10 + iVar14] + 1;
          histories.histogram[iVar4] = histories.histogram[iVar4] + 1;
          futures.histogram[iVar14] = futures.histogram[iVar14] + 1;
          iVar4 = (iVar4 * b + piVar6[lVar8]) - series[lVar8] * iVar11;
          iVar14 = (iVar14 * b + piVar5[lVar8]) - piVar6[lVar8] * iVar10;
          lVar2 = uVar1 + lVar8;
          lVar8 = lVar8 + 1;
        } while (lVar2 + 1U <= m);
        series = series + m;
        piVar5 = piVar5 + m;
        piVar6 = piVar6 + m;
      }
      futures.size = uVar15;
      histories.size = uVar12;
      histories.counts = futures.counts;
      states.histogram = __ptr;
      states.size = sVar13;
      states.counts = futures.counts;
      dVar16 = inform_shannon_mi(&states,&histories,&futures,2.0);
      free(__ptr);
    }
  }
  return dVar16;
}

Assistant:

double inform_predictive_info(int const *series, size_t n, size_t m, int b,
    size_t kpast, size_t kfuture, inform_error *err)
{
    if (check_arguments(series, n, m, b, kpast, kfuture, err)) return NAN;

    size_t const N = n * (m - kpast - kfuture + 1);

    size_t const histories_size = (size_t) pow((double) b, (double) kpast);
    size_t const futures_size = (size_t) pow((double) b, (double) kfuture);
    size_t const states_size = histories_size * futures_size;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };
    inform_dist futures   = { data + states_size + histories_size, futures_size, N };

    accumulate_observations(series, n, m, b, kpast, kfuture, &states,
        &histories, &futures);

    double pi = inform_shannon_mi(&states, &histories, &futures, 2.0);

    free(data);

    return pi;
}